

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

void * xmlHashQLookup3(xmlHashTablePtr table,xmlChar *prefix,xmlChar *name,xmlChar *prefix2,
                      xmlChar *name2,xmlChar *prefix3,xmlChar *name3)

{
  int iVar1;
  ulong uVar2;
  byte *pbVar3;
  byte *pbVar4;
  _xmlHashEntry *p_Var5;
  
  if (name != (xmlChar *)0x0 && table != (xmlHashTablePtr)0x0) {
    pbVar3 = prefix;
    if (prefix == (xmlChar *)0x0) {
      pbVar3 = name;
    }
    uVar2 = (ulong)*pbVar3 * 0x1e + (long)table->random_seed;
    pbVar3 = name;
    pbVar4 = prefix;
    if (prefix != (xmlChar *)0x0) {
      for (; (ulong)*pbVar4 != 0; pbVar4 = pbVar4 + 1) {
        uVar2 = uVar2 ^ (uVar2 >> 3) + uVar2 * 0x20 + (ulong)*pbVar4;
      }
      uVar2 = uVar2 ^ uVar2 * 0x20 + (uVar2 >> 3) + 0x3a;
    }
    for (; (ulong)*pbVar3 != 0; pbVar3 = pbVar3 + 1) {
      uVar2 = uVar2 ^ (uVar2 >> 3) + uVar2 * 0x20 + (ulong)*pbVar3;
    }
    uVar2 = (uVar2 >> 3) + uVar2 * 0x20 ^ uVar2;
    pbVar3 = prefix2;
    if (prefix2 != (xmlChar *)0x0) {
      for (; (ulong)*pbVar3 != 0; pbVar3 = pbVar3 + 1) {
        uVar2 = uVar2 ^ (uVar2 >> 3) + uVar2 * 0x20 + (ulong)*pbVar3;
      }
      uVar2 = uVar2 ^ uVar2 * 0x20 + (uVar2 >> 3) + 0x3a;
    }
    pbVar3 = name2;
    if (name2 != (xmlChar *)0x0) {
      for (; (ulong)*pbVar3 != 0; pbVar3 = pbVar3 + 1) {
        uVar2 = uVar2 ^ (uVar2 >> 3) + uVar2 * 0x20 + (ulong)*pbVar3;
      }
    }
    uVar2 = (uVar2 >> 3) + uVar2 * 0x20 ^ uVar2;
    pbVar3 = prefix3;
    if (prefix3 != (xmlChar *)0x0) {
      for (; (ulong)*pbVar3 != 0; pbVar3 = pbVar3 + 1) {
        uVar2 = uVar2 ^ (uVar2 >> 3) + uVar2 * 0x20 + (ulong)*pbVar3;
      }
      uVar2 = uVar2 ^ uVar2 * 0x20 + (uVar2 >> 3) + 0x3a;
    }
    pbVar3 = name3;
    if (name3 != (xmlChar *)0x0) {
      for (; (ulong)*pbVar3 != 0; pbVar3 = pbVar3 + 1) {
        uVar2 = uVar2 ^ (uVar2 >> 3) + uVar2 * 0x20 + (ulong)*pbVar3;
      }
    }
    uVar2 = uVar2 % (ulong)(long)table->size;
    if (table->table[uVar2].valid != 0) {
      for (p_Var5 = table->table + uVar2; p_Var5 != (_xmlHashEntry *)0x0; p_Var5 = p_Var5->next) {
        iVar1 = xmlStrQEqual(prefix,name,p_Var5->name);
        if (((iVar1 != 0) && (iVar1 = xmlStrQEqual(prefix2,name2,p_Var5->name2), iVar1 != 0)) &&
           (iVar1 = xmlStrQEqual(prefix3,name3,p_Var5->name3), iVar1 != 0)) {
          return p_Var5->payload;
        }
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void *
xmlHashQLookup3(xmlHashTablePtr table,
                const xmlChar *prefix, const xmlChar *name,
		const xmlChar *prefix2, const xmlChar *name2,
		const xmlChar *prefix3, const xmlChar *name3) {
    unsigned long key;
    xmlHashEntryPtr entry;

    if (table == NULL)
	return(NULL);
    if (name == NULL)
	return(NULL);
    key = xmlHashComputeQKey(table, prefix, name, prefix2,
                             name2, prefix3, name3);
    if (table->table[key].valid == 0)
	return(NULL);
    for (entry = &(table->table[key]); entry != NULL; entry = entry->next) {
	if ((xmlStrQEqual(prefix, name, entry->name)) &&
	    (xmlStrQEqual(prefix2, name2, entry->name2)) &&
	    (xmlStrQEqual(prefix3, name3, entry->name3)))
	    return(entry->payload);
    }
    return(NULL);
}